

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

Value * __thiscall
cmFileAPI::BuildClientReplyResponse
          (Value *__return_storage_ptr__,cmFileAPI *this,ClientRequest *request)

{
  Value *other;
  Value *__return_storage_ptr___00;
  Value VStack_68;
  Value local_40;
  
  __return_storage_ptr___00 = &VStack_68;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  if ((request->Error)._M_string_length == 0) {
    other = AddReplyIndexObject(this,&request->super_Object);
    Json::Value::Value(&VStack_68,other);
    Json::Value::operator=(__return_storage_ptr__,&VStack_68);
  }
  else {
    __return_storage_ptr___00 = &local_40;
    BuildReplyError(__return_storage_ptr___00,&request->Error);
    Json::Value::operator=(__return_storage_ptr__,__return_storage_ptr___00);
  }
  Json::Value::~Value(__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReplyResponse(ClientRequest const& request)
{
  Json::Value response;
  if (!request.Error.empty()) {
    response = this->BuildReplyError(request.Error);
    return response;
  }
  response = this->AddReplyIndexObject(request);
  return response;
}